

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O0

void aes_sliced_key_setup(aes_sliced_key *sk,void *vkey,size_t keybits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint64_t uVar29;
  uint64_t uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  bool bVar34;
  bool local_262;
  ulong local_260;
  size_t i_6;
  size_t i_5;
  ulong uStack_248;
  uint b;
  size_t i_4;
  size_t i_3;
  uint8_t rcon;
  uint16_t t67;
  uint16_t t66;
  uint16_t t65;
  uint16_t t64;
  uint16_t t63;
  uint16_t t62;
  uint16_t t61;
  uint16_t t60;
  uint16_t t59;
  uint16_t t58;
  uint16_t t57;
  uint16_t t56;
  uint16_t t55;
  uint16_t t54;
  uint16_t t53;
  uint16_t t52;
  uint16_t t51;
  uint16_t t50;
  uint16_t t49;
  uint16_t t48;
  uint16_t t47;
  uint16_t t46;
  uint16_t z17;
  uint16_t z16;
  uint16_t z15;
  uint16_t z14;
  uint16_t z13;
  uint16_t z12;
  uint16_t z11;
  uint16_t z10;
  uint16_t z9;
  uint16_t z8;
  uint16_t z7;
  uint16_t z6;
  uint16_t z5;
  uint16_t z4;
  uint16_t z3;
  uint16_t z2;
  uint16_t z1;
  uint16_t z0;
  uint16_t t45;
  uint16_t t44;
  uint16_t t43;
  uint16_t t42;
  uint16_t t41;
  uint16_t t40;
  uint16_t t39;
  uint16_t t38;
  uint16_t t37;
  uint16_t t36;
  uint16_t t35;
  uint16_t t34;
  uint16_t t33;
  uint16_t t32;
  uint16_t t31;
  uint16_t t30;
  uint16_t t29;
  uint16_t t28;
  uint16_t t27;
  uint16_t t26;
  uint16_t t25;
  uint16_t t24;
  uint16_t t23;
  uint16_t t22;
  uint16_t t21;
  uint16_t t20;
  uint16_t t19;
  uint16_t t18;
  uint16_t t17;
  uint16_t t16;
  uint16_t t15;
  uint16_t t14;
  uint16_t t13;
  uint16_t t12;
  uint16_t t11;
  uint16_t t10;
  uint16_t t9;
  uint16_t t8;
  uint16_t t7;
  uint16_t t6;
  uint16_t t5;
  uint16_t t4;
  uint16_t t3;
  uint16_t t2;
  uint16_t i0_1;
  uint16_t y18;
  uint16_t y21;
  uint16_t y16;
  uint16_t y19;
  uint16_t y17;
  uint16_t y7;
  uint16_t y11;
  uint16_t y10;
  uint16_t y6;
  uint16_t y20;
  uint16_t y15;
  uint16_t t1;
  uint16_t y3;
  uint16_t y5;
  uint16_t y2;
  uint16_t y12;
  uint16_t y4;
  uint16_t y1;
  uint16_t t0;
  uint16_t y8;
  uint16_t y9;
  uint16_t y13;
  uint16_t y14;
  size_t i_2;
  _Bool sub;
  ulong uStack_148;
  _Bool rotate_and_round_constant;
  size_t i_1;
  uint16_t *prevslices;
  uint bitshift;
  uint wordindex;
  uint64_t diff_6;
  uint64_t mask_6;
  uint64_t diff_5;
  uint shift_5;
  uint64_t mask_5;
  uint64_t diff_4;
  uint shift_4;
  uint64_t mask_4;
  uint64_t diff_3;
  uint shift_3;
  uint64_t mask_3;
  uint64_t diff_2;
  uint shift_2;
  uint64_t mask_2;
  uint64_t diff_1;
  uint shift_1;
  uint64_t mask_1;
  uint64_t diff;
  uint shift;
  uint64_t mask;
  uint64_t i1;
  uint64_t i0;
  size_t i;
  uint16_t slices [8];
  uint8_t inblk [16];
  int local_4c;
  uint16_t *puStack_48;
  uint outshift;
  uint16_t *outslices;
  uint rconpos;
  size_t sched_words;
  size_t key_words;
  uchar *key;
  size_t keybits_local;
  void *vkey_local;
  aes_sliced_key *sk_local;
  
  uVar28 = keybits >> 5;
  sk->rounds = (int)uVar28 + 6;
  uVar26 = sk->rounds + 1;
  outslices._4_4_ = 0;
  puStack_48 = sk->roundkeys_serial;
  local_4c = 0;
  memset(sk->roundkeys_serial,0,0xf0);
  memset(slices + 4,0,0x10);
  i0 = 0;
  do {
    if (uVar26 * 4 <= i0) {
      smemclr(slices + 4,0x10);
      smemclr(&i,0x10);
      for (i_6 = 8; i_6 < (ulong)(uVar26 & 0x3fffffff) << 3; i_6 = i_6 + 8) {
        sk->roundkeys_serial[i_6] = sk->roundkeys_serial[i_6] ^ 0xffff;
        sk->roundkeys_serial[i_6 + 1] = sk->roundkeys_serial[i_6 + 1] ^ 0xffff;
        sk->roundkeys_serial[i_6 + 5] = sk->roundkeys_serial[i_6 + 5] ^ 0xffff;
        sk->roundkeys_serial[i_6 + 6] = sk->roundkeys_serial[i_6 + 6] ^ 0xffff;
      }
      for (local_260 = 0; local_260 < (ulong)(uVar26 & 0x3fffffff) << 3; local_260 = local_260 + 1)
      {
        sk->roundkeys_parallel[local_260] = (ulong)sk->roundkeys_serial[local_260] * 0x1000100010001
        ;
      }
      return;
    }
    if (i0 < uVar28) {
      slices._8_4_ = *(undefined4 *)((long)vkey + i0 * 4);
      uVar29 = GET_64BIT_LSB_FIRST(slices + 4);
      uVar30 = GET_64BIT_LSB_FIRST(inblk);
      uVar31 = (uVar29 >> 7 ^ uVar29) & 0xaa00aa00aa00aa;
      uVar32 = uVar31 ^ uVar31 << 7 ^ uVar29;
      uVar31 = (uVar30 >> 7 ^ uVar30) & 0xaa00aa00aa00aa;
      uVar33 = uVar31 ^ uVar31 << 7 ^ uVar30;
      uVar31 = (uVar32 >> 0xe ^ uVar32) & 0xcccc0000cccc;
      uVar32 = uVar31 ^ uVar31 << 0xe ^ uVar32;
      uVar31 = (uVar33 >> 0xe ^ uVar33) & 0xcccc0000cccc;
      uVar33 = uVar31 ^ uVar31 << 0xe ^ uVar33;
      uVar31 = (uVar32 >> 0x1c ^ uVar32) & 0xf0f0f0f0;
      uVar32 = uVar31 ^ uVar31 << 0x1c ^ uVar32;
      uVar31 = (uVar33 >> 0x1c ^ uVar33) & 0xf0f0f0f0;
      uVar33 = uVar31 ^ uVar31 << 0x1c ^ uVar33;
      uVar31 = (uVar32 >> 8 ^ uVar33) & 0xff00ff00ff00ff;
      uVar32 = uVar31 << 8 ^ uVar32;
      uVar31 = uVar31 ^ uVar33;
      i._0_2_ = (ushort)uVar32;
      i._4_2_ = (ushort)(uVar32 >> 0x10);
      slices[0] = (uint16_t)(uVar32 >> 0x20);
      slices[2] = (uint16_t)(uVar32 >> 0x30);
      i._2_2_ = (ushort)uVar31;
      i._6_2_ = (ushort)(uVar31 >> 0x10);
      slices[1] = (uint16_t)(uVar31 >> 0x20);
      slices[3] = (uint16_t)(uVar31 >> 0x30);
    }
    else {
      uVar27 = (int)i0 - 1;
      for (uStack_148 = 0; uStack_148 < 8; uStack_148 = uStack_148 + 1) {
        slices[uStack_148 - 4] =
             (uint16_t)
             ((int)(uint)sk->roundkeys_serial[((uVar27 >> 2) << 3) + uStack_148] >>
             (sbyte)((uVar27 & 3) << 2));
      }
      bVar34 = i0 % uVar28 == 0;
      local_262 = true;
      if (bVar34) {
        for (_y8 = 0; _y8 < 8; _y8 = _y8 + 1) {
          slices[_y8 - 4] = (slices[_y8 - 4] << 3 | (ushort)((int)(uint)slices[_y8 - 4] >> 1)) & 0xf
          ;
        }
      }
      else {
        local_262 = uVar28 == 8 && (i0 & 7) == 4;
      }
      if (local_262) {
        uVar2 = slices[0] ^ i._4_2_;
        uVar3 = slices[3] ^ i._2_2_;
        uVar4 = slices[3] ^ slices[0];
        uVar5 = slices[3] ^ i._4_2_;
        uVar6 = slices[2] ^ slices[1];
        uVar7 = uVar6 ^ (ushort)i;
        uVar8 = uVar7 ^ slices[0];
        uVar9 = uVar3 ^ uVar2;
        uVar10 = uVar7 ^ i._2_2_;
        uVar11 = i._6_2_ ^ uVar9 ^ i._4_2_;
        uVar12 = i._6_2_ ^ uVar9 ^ slices[2];
        uVar13 = uVar11 ^ uVar6;
        uVar14 = uVar12 ^ uVar4;
        uVar6 = uVar6 ^ uVar14;
        uVar15 = uVar2 & (uVar13 ^ uVar14) ^ uVar4 & uVar14;
        uVar16 = uVar5 & uVar13 ^ uVar4 & uVar14;
        uVar12 = (uVar10 ^ uVar5) & (uVar11 ^ (ushort)i) ^ uVar9 & uVar11 ^ uVar15 ^ uVar12;
        uVar17 = uVar8 & (ushort)i ^ uVar9 & uVar11 ^ uVar16 ^ uVar13 ^ uVar5;
        uVar15 = uVar10 & uVar7 ^ uVar3 & uVar6 ^ uVar15 ^ uVar3 ^ uVar6;
        uVar18 = (uVar7 ^ slices[3]) & ((ushort)i ^ uVar14) ^ uVar3 & uVar6 ^ uVar16 ^
                 slices[3] ^ uVar6;
        uVar19 = uVar12 ^ uVar17;
        uVar12 = uVar12 & uVar15;
        uVar16 = uVar18 ^ uVar12;
        uVar20 = uVar19 & uVar16 ^ uVar17;
        uVar17 = (uVar17 ^ uVar12) & (uVar15 ^ uVar18) ^ uVar18;
        uVar18 = uVar18 & (uVar16 ^ uVar17);
        uVar15 = uVar18 ^ uVar15 ^ uVar17;
        uVar19 = uVar19 ^ uVar20 & (uVar16 ^ uVar18);
        uVar16 = uVar19 ^ uVar15;
        uVar12 = uVar20 ^ uVar17;
        uVar6 = (uVar20 ^ uVar19) & uVar6;
        uVar18 = uVar20 & ((ushort)i ^ uVar14);
        uVar21 = (uVar12 ^ uVar16) & (uVar13 ^ uVar14);
        uVar22 = uVar15 & (uVar10 ^ uVar5);
        uVar3 = (uVar20 ^ uVar19) & uVar3;
        uVar2 = (uVar12 ^ uVar16) & uVar2;
        uVar4 = uVar12 & uVar4 ^ uVar2;
        uVar10 = uVar18 ^ uVar19 & uVar10;
        uVar23 = (uVar17 ^ uVar15) & uVar11 ^ uVar6;
        uVar24 = uVar17 & (ushort)i ^ uVar3 ^ uVar23;
        uVar25 = uVar19 & uVar7 ^ uVar4;
        uVar6 = uVar6 ^ uVar12 & uVar14 ^ uVar21;
        uVar13 = uVar21 ^ uVar16 & uVar13 ^ uVar25;
        uVar25 = (uVar17 ^ uVar15) & uVar9 ^ uVar22 ^ uVar25;
        uVar9 = uVar19 & uVar7 ^ uVar6;
        uVar7 = uVar20 & (uVar7 ^ slices[3]) ^ uVar24 ^ uVar13;
        uVar11 = uVar15 & (uVar11 ^ (ushort)i) ^ uVar25;
        slices[3] = uVar6 ^ uVar25;
        slices[0] = uVar23 ^ uVar11;
        i._6_2_ = uVar17 & (ushort)i ^ uVar18 ^ uVar11;
        i._4_2_ = uVar22 ^ uVar17 & uVar8 ^ uVar7;
        i._0_2_ = uVar10 ^ uVar4 ^ uVar24 ^ 0xffff;
        i._2_2_ = uVar3 ^ uVar10 ^ uVar13 ^ 0xffff;
        slices[1] = uVar2 ^ uVar16 & uVar5 ^ uVar9 ^ uVar7 ^ 0xffff;
        slices[2] = uVar9 ^ slices[0] ^ 0xffff;
      }
      if (bVar34) {
        if (9 < outslices._4_4_) {
          __assert_fail("rconpos < lenof(aes_key_setup_round_constants)",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/aes-sw.c"
                        ,0x2b4,"void aes_sliced_key_setup(aes_sliced_key *, const void *, size_t)");
        }
        uVar27 = outslices._4_4_ + 1;
        bVar1 = aes_key_setup_round_constants[outslices._4_4_];
        for (i_4 = 0; outslices._4_4_ = uVar27, i_4 < 8; i_4 = i_4 + 1) {
          slices[i_4 - 4] = slices[i_4 - 4] ^ (ushort)((int)(uint)bVar1 >> ((byte)i_4 & 0x1f)) & 1;
        }
      }
      uVar27 = (int)i0 - (int)uVar28;
      for (uStack_248 = 0; uStack_248 < 8; uStack_248 = uStack_248 + 1) {
        slices[uStack_248 - 4] =
             slices[uStack_248 - 4] ^
             (ushort)((int)(uint)sk->roundkeys_serial[((uVar27 >> 2) << 3) + uStack_248] >>
                     (sbyte)((uVar27 & 3) << 2));
      }
    }
    for (i_5._4_4_ = 0; i_5._4_4_ < 8; i_5._4_4_ = i_5._4_4_ + 1) {
      puStack_48[i_5._4_4_] =
           puStack_48[i_5._4_4_] |
           (ushort)((slices[(ulong)i_5._4_4_ - 4] & 0xf) << ((byte)local_4c & 0x1f));
    }
    local_4c = local_4c + 4;
    if (local_4c == 0x10) {
      local_4c = 0;
      puStack_48 = puStack_48 + 8;
    }
    i0 = i0 + 1;
  } while( true );
}

Assistant:

static void aes_sliced_key_setup(
    aes_sliced_key *sk, const void *vkey, size_t keybits)
{
    const unsigned char *key = (const unsigned char *)vkey;

    size_t key_words = keybits / 32;
    sk->rounds = key_words + 6;
    size_t sched_words = (sk->rounds + 1) * 4;

    unsigned rconpos = 0;

    uint16_t *outslices = sk->roundkeys_serial;
    unsigned outshift = 0;

    memset(sk->roundkeys_serial, 0, sizeof(sk->roundkeys_serial));

    uint8_t inblk[16];
    memset(inblk, 0, 16);
    uint16_t slices[8];

    for (size_t i = 0; i < sched_words; i++) {
        /*
         * Prepare a word of round key in the low 4 bits of each
         * integer in slices[].
         */
        if (i < key_words) {
            memcpy(inblk, key + 4*i, 4);
            TO_BITSLICES(slices, inblk, uint16_t, =, 0);
        } else {
            unsigned wordindex, bitshift;
            uint16_t *prevslices;

            /* Fetch the (i-1)th key word */
            wordindex = i-1;
            bitshift = 4 * (wordindex & 3);
            prevslices = sk->roundkeys_serial + 8 * (wordindex >> 2);
            for (size_t i = 0; i < 8; i++)
                slices[i] = prevslices[i] >> bitshift;

            /* Decide what we're doing in this expansion stage */
            bool rotate_and_round_constant = (i % key_words == 0);
            bool sub = rotate_and_round_constant ||
                (key_words == 8 && i % 8 == 4);

            if (rotate_and_round_constant) {
                for (size_t i = 0; i < 8; i++)
                    slices[i] = ((slices[i] << 3) | (slices[i] >> 1)) & 0xF;
            }

            if (sub) {
                /* Apply the SubBytes transform to the key word. But
                 * here we need to apply the _full_ SubBytes from the
                 * spec, including the constant which our S-box leaves
                 * out. */
                BITSLICED_SUBBYTES(slices, slices, uint16_t);
                slices[0] ^= 0xFFFF;
                slices[1] ^= 0xFFFF;
                slices[5] ^= 0xFFFF;
                slices[6] ^= 0xFFFF;
            }

            if (rotate_and_round_constant) {
                assert(rconpos < lenof(aes_key_setup_round_constants));
                uint8_t rcon = aes_key_setup_round_constants[rconpos++];
                for (size_t i = 0; i < 8; i++)
                    slices[i] ^= 1 & (rcon >> i);
            }

            /* Combine with the (i-Nk)th key word */
            wordindex = i - key_words;
            bitshift = 4 * (wordindex & 3);
            prevslices = sk->roundkeys_serial + 8 * (wordindex >> 2);
            for (size_t i = 0; i < 8; i++)
                slices[i] ^= prevslices[i] >> bitshift;
        }

        /*
         * Now copy it into sk.
         */
        for (unsigned b = 0; b < 8; b++)
            outslices[b] |= (slices[b] & 0xF) << outshift;
        outshift += 4;
        if (outshift == 16) {
            outshift = 0;
            outslices += 8;
        }
    }

    smemclr(inblk, sizeof(inblk));
    smemclr(slices, sizeof(slices));

    /*
     * Add the S-box constant to every round key after the first one,
     * compensating for it being left out in the main cipher.
     */
    for (size_t i = 8; i < 8 * (sched_words/4); i += 8) {
        sk->roundkeys_serial[i+0] ^= 0xFFFF;
        sk->roundkeys_serial[i+1] ^= 0xFFFF;
        sk->roundkeys_serial[i+5] ^= 0xFFFF;
        sk->roundkeys_serial[i+6] ^= 0xFFFF;
    }

    /*
     * Replicate that set of round keys into larger integers for the
     * parallel versions of the cipher.
     */
    for (size_t i = 0; i < 8 * (sched_words / 4); i++) {
        sk->roundkeys_parallel[i] = sk->roundkeys_serial[i] *
            ((BignumInt)~(BignumInt)0 / 0xFFFF);
    }
}